

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  TokenType TVar1;
  Result RVar2;
  
  TVar1 = Peek(this,1);
  switch(TVar1) {
  case AssertExhaustion:
    RVar2 = ParseAssertActionTextCommand<wabt::AssertTrapCommandBase<(wabt::CommandType)11>>
                      (this,AssertExhaustion,out_command);
    return (Result)RVar2.enum_;
  case AssertInvalid:
    RVar2 = ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)4>>
                      (this,AssertInvalid,out_command);
    return (Result)RVar2.enum_;
  case AssertMalformed:
    RVar2 = ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)3>>
                      (this,AssertMalformed,out_command);
    return (Result)RVar2.enum_;
  case AssertReturn:
    RVar2 = ParseAssertReturnCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertReturnArithmeticNan:
    RVar2 = ParseAssertActionCommand<wabt::ActionCommandBase<(wabt::CommandType)9>>
                      (this,AssertReturnArithmeticNan,out_command);
    return (Result)RVar2.enum_;
  case AssertReturnCanonicalNan:
    RVar2 = ParseAssertActionCommand<wabt::ActionCommandBase<(wabt::CommandType)8>>
                      (this,AssertReturnCanonicalNan,out_command);
    return (Result)RVar2.enum_;
  case AssertTrap:
    RVar2 = ParseAssertTrapCommand(this,out_command);
    return (Result)RVar2.enum_;
  case AssertUnlinkable:
    RVar2 = ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)5>>
                      (this,AssertUnlinkable,out_command);
    return (Result)RVar2.enum_;
  default:
    __assert_fail("!\"ParseCommand should only be called when IsCommand() is true\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                  ,0x87b,"Result wabt::WastParser::ParseCommand(Script *, CommandPtr *)");
  case Get:
  case Invoke:
    RVar2 = ParseActionCommand(this,out_command);
    return (Result)RVar2.enum_;
  case Module:
    RVar2 = ParseModuleCommand(this,script,out_command);
    return (Result)RVar2.enum_;
  case Register:
    RVar2 = ParseRegisterCommand(this,out_command);
    return (Result)RVar2.enum_;
  }
}

Assistant:

Result WastParser::ParseCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseCommand);
  switch (Peek(1)) {
    case TokenType::AssertExhaustion:
      return ParseAssertExhaustionCommand(out_command);

    case TokenType::AssertInvalid:
      return ParseAssertInvalidCommand(out_command);

    case TokenType::AssertMalformed:
      return ParseAssertMalformedCommand(out_command);

    case TokenType::AssertReturn:
      return ParseAssertReturnCommand(out_command);

    case TokenType::AssertReturnArithmeticNan:
      return ParseAssertReturnArithmeticNanCommand(out_command);

    case TokenType::AssertReturnCanonicalNan:
      return ParseAssertReturnCanonicalNanCommand(out_command);

    case TokenType::AssertTrap:
      return ParseAssertTrapCommand(out_command);

    case TokenType::AssertUnlinkable:
      return ParseAssertUnlinkableCommand(out_command);

    case TokenType::Get:
    case TokenType::Invoke:
      return ParseActionCommand(out_command);

    case TokenType::Module:
      return ParseModuleCommand(script, out_command);

    case TokenType::Register:
      return ParseRegisterCommand(out_command);

    default:
      assert(!"ParseCommand should only be called when IsCommand() is true");
      return Result::Error;
  }
}